

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::get_minmax
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_rcdesc *rc,
          int sense,int want_index)

{
  char *pcVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  vm_val_t *this_00;
  ulong uVar8;
  long lVar9;
  vm_val_t ele;
  vm_val_t winner;
  int local_74;
  vm_val_t local_68;
  vm_val_t *local_58;
  CVmObjVector *local_50;
  vm_val_t local_48;
  vm_rcdesc *local_38;
  
  if (in_argc == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *in_argc;
  }
  local_50 = this;
  local_38 = rc;
  if (get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)::desc == '\0') {
    get_minmax();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,in_argc,&get_minmax::desc);
  if (iVar4 == 0) {
    if (uVar7 == 0) {
      this_00 = (vm_val_t *)0x0;
    }
    else {
      this_00 = sp_ + -1;
      iVar4 = vm_val_t::is_func_ptr(this_00);
      if (iVar4 == 0) {
        err_throw(0x900);
      }
    }
    pvVar3 = sp_;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = self;
    uVar8 = (ulong)*(ushort *)((local_50->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    local_58 = retval;
    if (uVar8 == 0) {
      err_throw(0x902);
    }
    uVar6 = 0;
    lVar9 = 4;
    local_74 = 0;
    do {
      pcVar1 = (local_50->super_CVmObjCollection).super_CVmObject.ext_;
      local_68.typ = (int)pcVar1[lVar9];
      vmb_get_dh_val(pcVar1 + lVar9,&local_68);
      pvVar3 = sp_;
      if (this_00 != (vm_val_t *)0x0) {
        sp_ = sp_ + 1;
        pvVar3->typ = local_68.typ;
        *(undefined4 *)&pvVar3->field_0x4 = local_68._4_4_;
        pvVar3->val = local_68.val;
        CVmRun::call_func_ptr(&G_interpreter_X,this_00,1,local_38,0);
        local_68.typ = r0_.typ;
        local_68._4_4_ = r0_._4_4_;
        local_68.val = r0_.val;
      }
      if (uVar6 == 0) {
        local_48.typ = local_68.typ;
        local_48._4_4_ = local_68._4_4_;
        local_48.val = local_68.val;
        local_74 = 0;
      }
      else {
        uVar5 = vm_val_t::compare_to(&local_68,&local_48);
        if (0 < (int)uVar5 && 0 < sense || (int)(uVar5 & sense) < 0) {
          local_48.typ = local_68.typ;
          local_48._4_4_ = local_68._4_4_;
          local_48.val = local_68.val;
          local_74 = (int)uVar6;
        }
      }
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 5;
    } while (uVar8 != uVar6);
    sp_ = sp_ + -(long)(int)(uVar7 + 1);
    if (want_index == 0) {
      local_58->typ = local_48.typ;
      *(undefined4 *)&local_58->field_0x4 = local_48._4_4_;
      local_58->val = local_48.val;
    }
    else {
      local_58->typ = VM_INT;
      (local_58->val).obj = local_74 + 1;
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::get_minmax(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *in_argc, const vm_rcdesc *rc,
                             int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push()->set_obj(self);

    /* if there are no elements, this is an error */
    int cnt = get_element_count();
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element(i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);

    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}